

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_allocator.hpp
# Opt level: O0

JsonPartialValue * __thiscall
MercuryJson::BlockAllocator<MercuryJson::JsonValue>::
construct<MercuryJson::shift_reduce_impl::JsonPartialValue,MercuryJson::shift_reduce_impl::JsonPartialArrayHead*>
          (BlockAllocator<MercuryJson::JsonValue> *this,JsonPartialArrayHead *args)

{
  JsonPartialArray *in_RSI;
  BlockAllocator<MercuryJson::JsonValue> *in_RDI;
  JsonPartialValue *ret;
  size_t in_stack_ffffffffffffffd8;
  JsonPartialValue *this_00;
  
  check_alloc(in_RDI,in_stack_ffffffffffffffd8);
  this_00 = (JsonPartialValue *)in_RDI->ptr;
  shift_reduce_impl::JsonPartialValue::JsonPartialValue(this_00,in_RSI);
  in_RDI->ptr = in_RDI->ptr + 0x10;
  in_RDI->allocated = in_RDI->allocated + 0x10;
  return this_00;
}

Assistant:

T *construct(Args ...args) {
            check_alloc(sizeof(T));
            static constexpr size_t size = round_up(sizeof(T), kAlignment);
            T *ret = new(ptr) T(std::forward<Args>(args)...);
            ptr += size;
            allocated += size;
            return ret;
        }